

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcoll.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char local_13;
  char local_12 [7];
  char empty [1];
  char cmpabcde [6];
  
  stack0xfffffffffffffff4 = 0;
  local_12[0] = 'a';
  local_12[1] = 'b';
  local_12[2] = 'c';
  local_12[3] = 'd';
  local_12[4] = 'e';
  local_12[5] = '\0';
  memset(&local_13,0,1);
  iVar1 = strcmp("abcde",local_12);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x1d,"strcmp( abcde, cmpabcde ) == 0");
  }
  iVar1 = strcmp(&local_13,"abcde");
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x20,"strcmp( empty, abcde ) < 0");
  }
  iVar1 = strcmp("abcde",&local_13);
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x21,"strcmp( abcde, empty ) > 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde";
    char empty[] = "";
    TESTCASE( strcmp( abcde, cmpabcde ) == 0 );
    TESTCASE( strcmp( abcde, abcdx ) < 0 );
    TESTCASE( strcmp( abcdx, abcde ) > 0 );
    TESTCASE( strcmp( empty, abcde ) < 0 );
    TESTCASE( strcmp( abcde, empty ) > 0 );
    return TEST_RESULTS;
}